

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O3

bool __thiscall IceCore::Container::Contains(Container *this,udword entry,udword *location)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar2 = (ulong)this->mCurNbEntries;
  uVar3 = 0;
  if (uVar2 == 0) {
    return false;
  }
  bVar5 = true;
  if (*this->mEntries != entry) {
    uVar4 = 0;
    do {
      if (uVar2 - 1 == uVar4) {
        return false;
      }
      uVar3 = uVar4 + 1;
      lVar1 = uVar4 + 1;
      uVar4 = uVar3;
    } while (this->mEntries[lVar1] != entry);
    bVar5 = uVar3 < uVar2;
  }
  if (location != (udword *)0x0) {
    *location = (udword)uVar3;
  }
  return bVar5;
}

Assistant:

bool Container::Contains(udword entry, udword* location) const
{
	// Look for the entry
	for(udword i=0;i<mCurNbEntries;i++)
	{
		if(mEntries[i]==entry)
		{
			if(location)	*location = i;
			return true;
		}
	}
	return false;
}